

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O2

void INT_CMConnection_failed(CMConnection conn)

{
  _CMCloseHandlerList *p_Var1;
  FILE *pFVar2;
  CManager p_Var3;
  CMConnection p_Var4;
  int iVar5;
  __pid_t _Var6;
  pthread_t pVar7;
  CMCloseHandlerList ptr;
  long lVar8;
  timespec ts;
  CMTaskHandle prior_task;
  
  prior_task = (CMTaskHandle)0x0;
  if (conn->failed == 0) {
    conn->failed = 1;
    transport_wake_any_pending_write(conn);
    iVar5 = CManager_locked(conn->cm);
    if (iVar5 == 0) {
      __assert_fail("CManager_locked(conn->cm)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                    ,0x52c,"void INT_CMConnection_failed(CMConnection)");
    }
    iVar5 = CMtrace_val[7];
    if (conn->cm->CMTrace_file == (FILE *)0x0) {
      iVar5 = CMtrace_init(conn->cm,CMFreeVerbose);
    }
    if (iVar5 != 0) {
      if (CMtrace_PID != 0) {
        pFVar2 = (FILE *)conn->cm->CMTrace_file;
        _Var6 = getpid();
        pVar7 = pthread_self();
        fprintf(pFVar2,"P%lxT%lx - ",(long)_Var6,pVar7);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&ts);
        fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
      }
      fprintf((FILE *)conn->cm->CMTrace_file,"CMConnection failed conn=%p\n",conn);
    }
    fflush((FILE *)conn->cm->CMTrace_file);
    CMconn_fail_conditions(conn);
    (*conn->trans->shutdown_conn)(&CMstatic_trans_svcs,conn->transport_data);
    get_long_attr(conn->characteristics,CM_BW_MEASURE_TASK,&prior_task);
    if (prior_task != (CMTaskHandle)0x0) {
      INT_CMremove_task(prior_task);
      set_long_attr(conn->characteristics,CM_BW_MEASURE_TASK,0);
    }
    ptr = conn->close_list;
    if (ptr != (CMCloseHandlerList)0x0) {
      conn->close_list = (CMCloseHandlerList)0x0;
      while (ptr != (CMCloseHandlerList)0x0) {
        p_Var1 = ptr->next;
        if (conn->closed == 0) {
          iVar5 = CMtrace_val[2];
          if (conn->cm->CMTrace_file == (FILE *)0x0) {
            iVar5 = CMtrace_init(conn->cm,CMConnectionVerbose);
          }
          if (iVar5 != 0) {
            if (CMtrace_PID != 0) {
              pFVar2 = (FILE *)conn->cm->CMTrace_file;
              _Var6 = getpid();
              pVar7 = pthread_self();
              fprintf(pFVar2,"P%lxT%lx - ",(long)_Var6,pVar7);
            }
            if (CMtrace_timing != 0) {
              clock_gettime(1,(timespec *)&ts);
              fprintf((FILE *)conn->cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
            }
            fprintf((FILE *)conn->cm->CMTrace_file,
                    "CM - Calling close handler %p for connection %p\n",ptr->close_handler,conn);
          }
          fflush((FILE *)conn->cm->CMTrace_file);
          IntCManager_unlock(conn->cm,
                             "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                             ,0x540);
          (*ptr->close_handler)(conn->cm,conn,ptr->close_client_data);
          IntCManager_lock(conn->cm,
                           "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm.c"
                           ,0x542);
        }
        INT_CMfree(ptr);
        ptr = p_Var1;
      }
    }
    conn->closed = 1;
    p_Var3 = conn->cm;
    iVar5 = 0;
    for (lVar8 = 0; lVar8 < p_Var3->connection_count; lVar8 = lVar8 + 1) {
      p_Var4 = p_Var3->connections[lVar8];
      if (p_Var4 == conn) {
        iVar5 = iVar5 + 1;
        INT_CMConnection_dereference(conn);
      }
      else if (iVar5 == 0) {
        iVar5 = 0;
      }
      else {
        p_Var3->connections[lVar8 + -1] = p_Var4;
      }
    }
    if (iVar5 == 0) {
      fwrite("Internal error, remove_conn_from_CM.  Not found\n",0x30,1,_stderr);
    }
    else {
      p_Var3->connection_count = p_Var3->connection_count + -1;
      p_Var3->abort_read_ahead = 1;
    }
  }
  return;
}

Assistant:

void
INT_CMConnection_failed(CMConnection conn)
{
    CMTaskHandle prior_task = NULL;
    if (conn->failed) return;
    conn->failed = 1;
    transport_wake_any_pending_write(conn);

    assert(CManager_locked(conn->cm));
    CMtrace_out(conn->cm, CMFreeVerbose, "CMConnection failed conn=%p\n", 
		conn);
    CMconn_fail_conditions(conn);
    conn->trans->shutdown_conn(&CMstatic_trans_svcs, conn->transport_data);
    get_long_attr(conn->characteristics, CM_BW_MEASURE_TASK, 
		  (ssize_t*)(intptr_t)&prior_task);
    if (prior_task) {
	INT_CMremove_task(prior_task);
	set_long_attr(conn->characteristics, CM_BW_MEASURE_TASK, (intptr_t)0);
    }
    if (conn->close_list) {
	CMCloseHandlerList list = conn->close_list;
	conn->close_list = NULL;
	while (list != NULL) {
	    CMCloseHandlerList next = list->next;
	    if (! conn->closed ) {
		CMtrace_out(conn->cm, CMConnectionVerbose, 
			    "CM - Calling close handler %p for connection %p\n",
			    (void*) list->close_handler, (void*)conn);
		CManager_unlock(conn->cm);
		list->close_handler(conn->cm, conn, list->close_client_data);
		CManager_lock(conn->cm);
	    }
	    INT_CMfree(list);
	    list = next;
	}
    }
    conn->closed = 1;
    remove_conn_from_CM(conn->cm, conn);
}